

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall QSslSocketPrivate::_q_connectedSlot(QSslSocketPrivate *this)

{
  QAbstractSocket *this_00;
  quint16 qVar1;
  undefined4 uVar2;
  qintptr qVar3;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocket **)
             &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8;
  qVar1 = QAbstractSocket::localPort(&this->plainSocket->super_QAbstractSocket);
  QAbstractSocket::setLocalPort(this_00,qVar1);
  QAbstractSocket::localAddress((QAbstractSocket *)&local_38);
  QAbstractSocket::setLocalAddress(this_00,(QHostAddress *)&local_38);
  QHostAddress::~QHostAddress((QHostAddress *)&local_38);
  qVar1 = QAbstractSocket::peerPort(&this->plainSocket->super_QAbstractSocket);
  QAbstractSocket::setPeerPort(this_00,qVar1);
  QAbstractSocket::peerAddress((QAbstractSocket *)&local_38);
  QAbstractSocket::setPeerAddress(this_00,(QHostAddress *)&local_38);
  QHostAddress::~QHostAddress((QHostAddress *)&local_38);
  QAbstractSocket::peerName(&local_38,&this->plainSocket->super_QAbstractSocket);
  QAbstractSocket::setPeerName(this_00,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  qVar3 = (**(code **)(*(long *)&this->plainSocket->super_QAbstractSocket + 0x110))();
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar3;
  uVar2 = QIODevice::readChannelCount();
  *(undefined4 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = uVar2;
  uVar2 = QIODevice::writeChannelCount();
  *(undefined4 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xac = uVar2;
  if (this->autoStartHandshake == true) {
    QSslSocket::startClientEncryption((QSslSocket *)this_00);
  }
  QAbstractSocket::connected(this_00);
  if (((this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose == true) &&
     (this->autoStartHandshake == false)) {
    (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose = false;
    (**(code **)(*(long *)this_00 + 0x100))(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_connectedSlot()
{
    Q_Q(QSslSocket);
    q->setLocalPort(plainSocket->localPort());
    q->setLocalAddress(plainSocket->localAddress());
    q->setPeerPort(plainSocket->peerPort());
    q->setPeerAddress(plainSocket->peerAddress());
    q->setPeerName(plainSocket->peerName());
    cachedSocketDescriptor = plainSocket->socketDescriptor();
    readChannelCount = plainSocket->readChannelCount();
    writeChannelCount = plainSocket->writeChannelCount();

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_connectedSlot()";
    qCDebug(lcSsl) << "\tstate =" << q->state();
    qCDebug(lcSsl) << "\tpeer =" << q->peerName() << q->peerAddress() << q->peerPort();
    qCDebug(lcSsl) << "\tlocal =" << QHostInfo::fromName(q->localAddress().toString()).hostName()
             << q->localAddress() << q->localPort();
#endif

    if (autoStartHandshake)
        q->startClientEncryption();

    emit q->connected();

    if (pendingClose && !autoStartHandshake) {
        pendingClose = false;
        q->disconnectFromHost();
    }
}